

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

bool __thiscall
OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
operator()(OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  string *in_RSI;
  bool local_91;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffffb0;
  string local_38 [55];
  bool local_1;
  
  std::__cxx11::string::string(local_38,in_RSI);
  bVar1 = EqualIgnoreCaseConstraint::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  local_91 = true;
  if (!bVar1) {
    std::__cxx11::string::string(local_68,in_RSI);
    local_91 = EqualIgnoreCaseConstraint::operator()
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  local_1 = local_91;
  if (!bVar1) {
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool operator()(DataType data) const {
      return cons1_(data) || cons2_(data);
    }